

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O2

bool __thiscall
unixsocketipc::MessageReceiver::receive_message
          (MessageReceiver *this,int client_socket_fd,uint32_t *id,char *buf,uint32_t *size)

{
  bool bVar1;
  
  bVar1 = receive_buffer(this,client_socket_fd,(char *)id,4);
  if (bVar1) {
    bVar1 = receive_buffer(this,client_socket_fd,(char *)size,4);
    if (bVar1) {
      bVar1 = receive_buffer(this,client_socket_fd,buf,*size);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool MessageReceiver::receive_message(int client_socket_fd, uint32_t &id, char* buf, uint32_t &size ) {
   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&id), sizeof(id)))
      return false;

   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&size), sizeof(size)))
      return false;

   assert(size <= MESSAGE_BUFF_SIZE && "Received message size exceeds reception buffer size!");

   if (!receive_buffer(client_socket_fd, buf, size))
      return false;

   return true;
}